

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpege_api_v2.c
# Opt level: O1

MPP_RET jpege_start(void *ctx,HalEncTask *task)

{
  MppPacket packet;
  RK_S32 RVar1;
  void *p;
  size_t sVar2;
  int val;
  int val_00;
  MppWriteCtx bit_ctx;
  MppWriteCtx local_60;
  
  RVar1 = *(RK_S32 *)((long)ctx + 0x88);
  val_00 = *(int *)((long)ctx + 0x8c);
  val = *(int *)((long)ctx + 0x90);
  packet = task->packet;
  p = mpp_packet_get_pos(packet);
  sVar2 = mpp_packet_get_size(packet);
  mpp_writer_init(&local_60,p,(RK_S32)sVar2);
  mpp_writer_put_raw_bits(&local_60,0xffd8,0x10);
  mpp_writer_put_raw_bits(&local_60,0xffe0,0x10);
  mpp_writer_put_raw_bits(&local_60,0x10,0x10);
  mpp_writer_put_raw_bits(&local_60,0x4a46,0x10);
  mpp_writer_put_raw_bits(&local_60,0x4946,0x10);
  mpp_writer_put_raw_bits(&local_60,0,8);
  mpp_writer_put_raw_bits(&local_60,0x102,0x10);
  if (val == 0 || val_00 == 0) {
    mpp_writer_put_raw_bits(&local_60,0,8);
    mpp_writer_put_raw_bits(&local_60,0,8);
    val = 1;
    val_00 = 1;
    RVar1 = 8;
  }
  else {
    mpp_writer_put_raw_bits(&local_60,RVar1,8);
    RVar1 = 0x10;
  }
  mpp_writer_put_raw_bits(&local_60,val_00,RVar1);
  mpp_writer_put_raw_bits(&local_60,val,0x10);
  mpp_writer_put_raw_bits(&local_60,0,8);
  mpp_writer_put_raw_bits(&local_60,0,8);
  RVar1 = mpp_writer_bytes(&local_60);
  mpp_packet_set_length(packet,(long)RVar1);
  task->length = task->length + RVar1;
  return MPP_OK;
}

Assistant:

static MPP_RET jpege_start(void *ctx, HalEncTask *task)
{
    JpegeCtx *p = (JpegeCtx *)ctx;
    JpegeSyntax syntax = p->syntax;
    MppPacket pkt = task->packet;
    RK_U8 *ptr = mpp_packet_get_pos(pkt);
    size_t buf_size = mpp_packet_get_size(pkt);
    RK_S32 size = 0;
    MppWriteCtx bit_ctx;
    MppWriteCtx *bits = &bit_ctx;

    mpp_writer_init(bits, ptr, buf_size);

    /* add SOI and APP0 data */
    /* SOI */
    mpp_writer_put_raw_bits(bits, 0xFFD8, 16);
    /* APP0 */
    mpp_writer_put_raw_bits(bits, 0xFFE0, 16);
    /* length */
    mpp_writer_put_raw_bits(bits, 0x0010, 16);
    /* "JFIF" ID */
    /* Ident1 */
    mpp_writer_put_raw_bits(bits, 0x4A46, 16);
    /* Ident2 */
    mpp_writer_put_raw_bits(bits, 0x4946, 16);
    /* Ident3 */
    mpp_writer_put_raw_bits(bits, 0x00, 8);
    /* Version */
    mpp_writer_put_raw_bits(bits, 0x0102, 16);

    if (syntax.density_x && syntax.density_y) {
        /* Units */
        mpp_writer_put_raw_bits(bits, syntax.units_type, 8);
        /* Xdensity */
        mpp_writer_put_raw_bits(bits, syntax.density_x, 16);
        /* Ydensity */
        mpp_writer_put_raw_bits(bits, syntax.density_y, 16);
    } else {
        /* Units */
        mpp_writer_put_raw_bits(bits, 0, 8);
        /* Xdensity */
        mpp_writer_put_raw_bits(bits, 0, 8);
        mpp_writer_put_raw_bits(bits, 1, 8);
        /* Ydensity */
        mpp_writer_put_raw_bits(bits, 1, 16);
    }
    /* XThumbnail */
    mpp_writer_put_raw_bits(bits, 0x00, 8);
    /* YThumbnail */
    mpp_writer_put_raw_bits(bits, 0x00, 8);
    /* Do NOT write thumbnail */
    size = mpp_writer_bytes(bits);
    mpp_packet_set_length(pkt, size);
    task->length += size;

    return MPP_OK;
}